

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O3

bool bssl::ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred)

{
  OPENSSL_STACK *sk;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CRYPTO_BUFFER *buf;
  uint8_t *puVar4;
  size_t sVar5;
  size_t i;
  int line;
  Span<const_unsigned_char> dn;
  CBS cbs;
  CBS candidate;
  CBS local_50;
  CBS local_40;
  
  bVar1 = true;
  if (cred->must_match_issuer == true) {
    sk = (OPENSSL_STACK *)
         (hs->ca_names)._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
         _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if ((sk != (OPENSSL_STACK *)0x0) && (sVar3 = OPENSSL_sk_num(sk), sVar3 != 0)) {
      i = 0;
      do {
        buf = (CRYPTO_BUFFER *)OPENSSL_sk_value(sk,i);
        puVar4 = CRYPTO_BUFFER_data(buf);
        sVar5 = CRYPTO_BUFFER_len(buf);
        dn.size_ = sVar5;
        dn.data_ = puVar4;
        bVar1 = ssl_credential_st::ChainContainsIssuer(cred,dn);
        if (bVar1) {
          return true;
        }
        i = i + 1;
      } while (sVar3 != i);
    }
    if (((cred->trust_anchor_id).size_ != 0) &&
       ((hs->peer_requested_trust_anchors).
        super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
        super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
        super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged == true)) {
      local_50.data =
           (hs->peer_requested_trust_anchors).
           super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
           super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
           super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.data_;
      local_50.len = (hs->peer_requested_trust_anchors).
                     super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
                     super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                     super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.
                     size_;
      if (local_50.len != 0) {
        do {
          iVar2 = CBS_get_u8_length_prefixed(&local_50,&local_40);
          if ((iVar2 == 0) || (local_40.len == 0)) {
            iVar2 = 0x44;
            line = 0x5a;
            goto LAB_00153d28;
          }
          if ((local_40.len == (cred->trust_anchor_id).size_) &&
             (iVar2 = bcmp(local_40.data,(cred->trust_anchor_id).data_,local_40.len), iVar2 == 0)) {
            hs->field_0x6cb = hs->field_0x6cb | 4;
            return true;
          }
        } while (local_50.len != 0);
      }
    }
    iVar2 = 0x143;
    line = 100;
LAB_00153d28:
    bVar1 = false;
    ERR_put_error(0x10,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,line);
  }
  return bVar1;
}

Assistant:

bool ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,
                                              const SSL_CREDENTIAL *cred) {
  if (!cred->must_match_issuer) {
    // This credential does not need to match a requested issuer, so
    // it is good to use without a match.
    return true;
  }

  // If we have names sent by the CA extension, and this
  // credential matches it, it is good.
  if (hs->ca_names != nullptr) {
    for (const CRYPTO_BUFFER *ca_name : hs->ca_names.get()) {
      if (cred->ChainContainsIssuer(
              Span(CRYPTO_BUFFER_data(ca_name), CRYPTO_BUFFER_len(ca_name)))) {
        return true;
      }
    }
  }
  // If the credential has a trust anchor ID and it matches one sent by the
  // peer, it is good.
  if (!cred->trust_anchor_id.empty() && hs->peer_requested_trust_anchors) {
    CBS cbs = CBS(*hs->peer_requested_trust_anchors), candidate;
    while (CBS_len(&cbs) > 0) {
      if (!CBS_get_u8_length_prefixed(&cbs, &candidate) ||
          CBS_len(&candidate) == 0) {
        OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
        return false;
      }
      if (candidate == Span(cred->trust_anchor_id)) {
        hs->matched_peer_trust_anchor = true;
        return true;
      }
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_MATCHING_ISSUER);
  return false;
}